

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O3

void UnserializeFromVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>>>
               (DataStream *s,
               ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *args)

{
  pointer pbVar1;
  size_type sVar2;
  pointer pbVar3;
  uint64_t uVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  ParamsStream<DataStream_&,_TransactionSerParams> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = ReadCompactSize<DataStream>(s,true);
  pbVar1 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar2 = s->m_read_pos;
  pbVar3 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.m_params = args->m_params;
  local_38.m_substream = s;
  Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>(&local_38,args->m_object)
  ;
  if ((s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish +
      (uVar4 - (long)((s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_start + s->m_read_pos)) ==
      pbVar1 + -(long)(pbVar3 + sVar2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    local_38.m_substream = (DataStream *)std::iostream_category();
    local_38.m_params = (TransactionSerParams *)CONCAT44(local_38.m_params._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar5,(error_code *)"Size of value was not the stated size");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UnserializeFromVector(Stream& s, X&&... args)
{
    size_t expected_size = ReadCompactSize(s);
    size_t remaining_before = s.size();
    UnserializeMany(s, args...);
    size_t remaining_after = s.size();
    if (remaining_after + expected_size != remaining_before) {
        throw std::ios_base::failure("Size of value was not the stated size");
    }
}